

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_check_dup_typedefs(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *tpdfs_global;
  lysp_include *plVar2;
  lysp_tpdf *plVar3;
  ulong uVar4;
  lysp_tpdf *plVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar6 = 0;
  tpdfs_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  uVar7 = 0xffffffffffffffff;
  while( true ) {
    plVar5 = mod->typedefs;
    if (plVar5 == (lysp_tpdf *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ulong *)&plVar5[-1].flags;
    }
    uVar7 = uVar7 + 1;
    if (uVar8 <= uVar7) break;
    plVar5 = (lysp_tpdf *)((long)&plVar5->name + lVar6);
    lVar6 = lVar6 + 0xb0;
    LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar5,tpdfs_global);
    if (LVar1 != LY_SUCCESS) goto LAB_0015ff31;
  }
  plVar2 = mod->includes;
  uVar7 = 0;
  while( true ) {
    if (plVar2 == (lysp_include *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ulong *)(plVar2[-1].rev + 8);
    }
    if (uVar8 <= uVar7) break;
    uVar8 = 0xffffffffffffffff;
    lVar6 = 0;
    while( true ) {
      plVar2 = mod->includes;
      plVar5 = (plVar2[uVar7].submodule)->typedefs;
      if (plVar5 == (lysp_tpdf *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)&plVar5[-1].flags;
      }
      uVar8 = uVar8 + 1;
      if (uVar4 <= uVar8) break;
      plVar5 = (lysp_tpdf *)((long)&plVar5->name + lVar6);
      lVar6 = lVar6 + 0xb0;
      LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar5,tpdfs_global);
      if (LVar1 != LY_SUCCESS) goto LAB_0015ff31;
    }
    uVar7 = uVar7 + 1;
  }
  if ((ctx->tpdfs_nodes).count == 0) {
    LVar1 = LY_SUCCESS;
  }
  else {
    uVar7 = 0;
    do {
      plVar3 = lysp_node_typedefs((lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar7]);
      uVar8 = 0xffffffffffffffff;
      plVar5 = plVar3;
      while( true ) {
        if (plVar3 == (lysp_tpdf *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ulong *)&plVar3[-1].flags;
        }
        uVar8 = uVar8 + 1;
        if (uVar4 <= uVar8) break;
        LVar1 = lysp_check_dup_typedef
                          (ctx,(lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar7],plVar5,
                           tpdfs_global);
        plVar5 = plVar5 + 1;
        if (LVar1 != LY_SUCCESS) goto LAB_0015ff31;
      }
      uVar7 = uVar7 + 1;
      LVar1 = LY_SUCCESS;
    } while (uVar7 < (ctx->tpdfs_nodes).count);
  }
LAB_0015ff31:
  lyht_free(tpdfs_global,(_func_void_void_ptr *)0x0);
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_typedefs(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_tpdf *typedefs;
    LY_ARRAY_COUNT_TYPE u, v;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    /* check name collisions - typedefs and groupings */
    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_ARRAY_FOR(mod->typedefs, v) {
        ret = lysp_check_dup_typedef(ctx, NULL, &mod->typedefs[v], ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, v) {
        LY_ARRAY_FOR(mod->includes[v].submodule->typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, NULL, &mod->includes[v].submodule->typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->tpdfs_nodes.count; ++i) {
        typedefs = lysp_node_typedefs((struct lysp_node *)ctx->tpdfs_nodes.objs[i]);
        LY_ARRAY_FOR(typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, (struct lysp_node *)ctx->tpdfs_nodes.objs[i], &typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}